

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

bool __thiscall
jsoncons::typed_array_visitor<std::vector<double,_std::allocator<double>_>_>::visit_int64
          (typed_array_visitor<std::vector<double,_std::allocator<double>_>_> *this,int64_t value,
          semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  double local_8;
  
  local_8 = (double)value;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this->v_,&local_8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }